

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O2

unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> __thiscall
genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::create(genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *className,
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *parms)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                  *)className,(key_type *)parms);
  if (cVar1._M_node == (_Base_ptr)&className->_M_string_length) {
    *(undefined8 *)&(this->registry)._M_t._M_impl = 0;
  }
  else {
    (**(code **)(cVar1._M_node + 2))(this);
  }
  return (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>)
         (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<manufacturedObj> genericFactory<manufacturedObj, classIDKey>::create(const classIDKey &className, std::vector<std::string> &parms) const
{
  std::unique_ptr<manufacturedObj> ret(nullptr);
  
  typename FN_REGISTRY::const_iterator regEntry=registry.find(className);
  if (regEntry != registry.end()) {
    return (*regEntry).second(parms);
  }
  return ret;
}